

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O1

_Bool borg_think_home_buy_useful(void)

{
  uint8_t *puVar1;
  int16_t *piVar2;
  short sVar3;
  short sVar4;
  uint8_t uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int32_t iVar9;
  char *what;
  bool bVar10;
  ulong uVar11;
  long lVar12;
  borg_item_conflict *pbVar13;
  bool bVar14;
  borg_item *item;
  ulong uVar15;
  int local_74;
  int32_t local_6c;
  int local_5c;
  int local_48;
  int local_44;
  
  local_6c = borg.power;
  bVar10 = false;
  if (z_info->store_inven_max == 0) {
    local_5c = -1;
  }
  else {
    local_5c = -1;
    uVar15 = 0;
    bVar10 = false;
    local_48 = 0;
    local_44 = 0;
    local_74 = 0;
    do {
      if (borg_shops[7].ware[uVar15].iqty != '\0') {
        item = (borg_item *)(borg_shops[7].ware + uVar15);
        if (L'\0' < sold_item_num) {
          lVar12 = 0;
          bVar14 = false;
          do {
            if (((sold_item_tval[lVar12] == (uint)item->tval) &&
                (sold_item_sval[lVar12] == (uint)item->sval)) && (bVar14 = true, *borg_cfg != 0)) {
              what = format("# Choosing not to buy back \'%s\' from home.",item);
              borg_note(what);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < sold_item_num);
          if (bVar14) goto LAB_00243196;
        }
        wVar6 = borg_first_empty_inventory_slot();
        if (wVar6 != L'\xffffffff') {
          if ((item->tval & 0xfe) == 0x16) {
            local_74 = (int)item->pval / (int)(uint)item->iqty;
          }
          wVar7 = borg_min_item_quantity((borg_item_conflict *)item);
          pbVar13 = borg_shops[7].ware;
          puVar1 = &pbVar13[uVar15].iqty;
          uVar5 = (uint8_t)wVar7;
          *puVar1 = *puVar1 - uVar5;
          sVar3 = (short)wVar7;
          sVar4 = (short)local_74;
          if ((item->tval & 0xfe) == 0x16) {
            piVar2 = &pbVar13[uVar15].pval;
            *piVar2 = *piVar2 - sVar3 * sVar4;
          }
          wVar7 = borg_wield_slot(item);
          wVar8 = borg_slot((uint)item->tval,(uint)item->sval);
          if (wVar7 < L'\0') {
            iVar9 = 0;
          }
          else {
            if ((int)((uint)z_info->pack_size - borg.trait[0x9e]) <= wVar6 + L'\x01')
            goto LAB_00243196;
            lVar12 = (ulong)z_info->pack_size + 3;
            if (wVar7 == (wchar_t)lVar12) {
              if (borg_items[lVar12].one_ring == false) {
                memcpy(borg_items + wVar6,safe_items + (uint)wVar7,0x388);
                memcpy(borg_items + (uint)wVar7,borg_safe_shops[7].ware + uVar15,0x388);
                borg_items[(uint)wVar7].iqty = '\x01';
                borg_notice(true);
                local_44 = borg_power();
                memcpy(borg_items + (uint)wVar7,safe_items + (uint)wVar7,0x388);
                bVar10 = true;
              }
              if (borg_items[(ulong)z_info->pack_size + 2].one_ring == false) {
                memcpy(borg_items + wVar6,safe_items + (ulong)z_info->pack_size + 2,0x388);
                memcpy(borg_items + (ulong)z_info->pack_size + 2,borg_safe_shops[7].ware + uVar15,
                       0x388);
                borg_items[(ulong)z_info->pack_size + 2].iqty = uVar5;
                borg_notice(true);
                local_48 = borg_power();
                memcpy(borg_items + (ulong)z_info->pack_size + 2,
                       safe_items + (ulong)z_info->pack_size + 2,0x388);
                bVar10 = true;
              }
              iVar9 = local_44;
              if (local_44 < local_48) {
                iVar9 = local_48;
              }
              uVar11 = (ulong)wVar6;
              pbVar13 = borg_items + uVar11;
            }
            else {
              uVar11 = (ulong)(uint)wVar7;
              memcpy(borg_items + wVar6,safe_items + uVar11,0x388);
              memcpy(borg_items + uVar11,borg_safe_shops[7].ware + uVar15,0x388);
              borg_items[uVar11].iqty = uVar5;
              borg_notice(true);
              iVar9 = borg_power();
              pbVar13 = borg_items + uVar11;
              bVar10 = true;
            }
            memcpy(pbVar13,safe_items + uVar11,0x388);
          }
          if (iVar9 <= local_6c) {
            if (L'\xffffffff' < wVar7) {
              borg_items[wVar6].iqty = '\0';
            }
            wVar7 = wVar8;
            if ((wVar8 == L'\xffffffff') &&
               (wVar7 = wVar6, (int)((uint)z_info->pack_size - borg.trait[0x9e]) <= wVar6 + L'\x01')
               ) goto LAB_00243196;
            wVar6 = wVar7;
            memcpy(borg_items + wVar6,borg_safe_shops[7].ware + uVar15,0x388);
            pbVar13 = borg_items;
            if (wVar8 == L'\xffffffff') {
              borg_items[wVar6].iqty = uVar5;
              if ((item->tval & 0xfe) == 0x16) {
                pbVar13[wVar6].pval = sVar3 * sVar4;
              }
            }
            else {
              borg_items[wVar6].iqty = safe_items[wVar6].iqty + uVar5;
              if ((item->tval & 0xfe) == 0x16) {
                piVar2 = &pbVar13[wVar6].pval;
                *piVar2 = *piVar2 + sVar3 * sVar4;
              }
            }
            borg_notice(true);
            bVar10 = true;
            iVar9 = borg_power();
          }
          memcpy(borg_items + wVar6,safe_items + wVar6,0x388);
          memcpy(borg_shops[7].ware + uVar15,borg_safe_shops[7].ware + uVar15,0x388);
          if (local_6c < iVar9) {
            local_5c = (int)uVar15;
            local_6c = iVar9;
          }
        }
      }
LAB_00243196:
      uVar15 = uVar15 + 1;
    } while (uVar15 < z_info->store_inven_max);
  }
  if (bVar10) {
    borg_notice(true);
  }
  if (borg.power < local_6c && -1 < local_5c) {
    borg.goal.shop = 7;
    borg.goal.ware = (int16_t)local_5c;
  }
  return borg.power < local_6c && -1 < local_5c;
}

Assistant:

bool borg_think_home_buy_useful(void)
{

    int     hole;
    int     slot, i;
    int     stack;
    int     qty = 1;
    int     n, b_n = -1;
    int     charge_each = 0;
    int32_t p, b_p = 0L;
    int32_t p_left  = 0;
    int32_t p_right = 0;

    bool fix        = false;
    bool skip_it    = false;

    /* Extract the "power" */
    b_p = borg.power;

    /* Scan the home */
    for (n = 0; n < z_info->store_inven_max; n++) {
        borg_item *item = &borg_shops[BORG_HOME].ware[n];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip it if I just sold it */
        skip_it = false;
        for (i = 0; i < sold_item_num; i++) {
            if (sold_item_tval[i] == item->tval
                && sold_item_sval[i] == item->sval) {
                if (borg_cfg[BORG_VERBOSE])
                    borg_note(
                        format("# Choosing not to buy back '%s' from home.",
                            item->desc));
                skip_it = true;
            }
        }
        if (skip_it == true)
            continue;

        /* Reset the 'hole' in case it was changed by the last stacked item.*/
        hole = borg_first_empty_inventory_slot();
        if (hole == -1)
            continue;

        /* borg_note(format("# Considering buying (%d)'%s' (pval=%d) from
         * home.", item->iqty,item->desc, item->pval)); */

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            charge_each = item->pval / item->iqty;

        /* Save the number */
        qty = borg_min_item_quantity(item);

        /* Remove one item from shop (sometimes) */
        borg_shops[BORG_HOME].ware[n].iqty -= qty;

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            borg_shops[BORG_HOME].ware[n].pval -= (qty * charge_each);

        /* Obtain "slot" */
        slot  = borg_wield_slot(item);
        stack = borg_slot(item->tval, item->sval);

        /* Consider new equipment-- Must check both ring slots */
        p = 0;
        if (slot >= 0) {
            /* Require two empty slots */
            if (hole == -1)
                continue;
            if ((hole + 1) >= PACK_SLOTS)
                continue;

            /* Check Rings */
            if (slot == INVEN_LEFT) {
                /** First Check Left Hand **/

                /* special curse check for left ring */
                if (!borg_items[INVEN_LEFT].one_ring) {
                    /* Move equipment into inventory */
                    memcpy(&borg_items[hole], &safe_items[slot],
                        sizeof(borg_item));

                    /* Move new item into equipment */
                    memcpy(&borg_items[slot],
                        &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

                    /* Only a single item */
                    borg_items[slot].iqty = 1;

                    /* Fix later */
                    fix = true;

                    /* Examine the inventory */
                    borg_notice(true);

                    /* Evaluate the inventory */
                    p_left = borg_power();
#if 0
                    /* dump list and power...  for debugging */
                    borg_note(format("Trying Item %s (best power %ld)", borg_items[slot].desc, p_left));
                    borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[slot].desc, borg.power));
#endif
                    /* Restore old item */
                    memcpy(&borg_items[slot], &safe_items[slot],
                        sizeof(borg_item));
                }

                /** Second Check Right Hand **/
                /* special curse check for right ring */
                if (!borg_items[INVEN_RIGHT].one_ring) {
                    /* Move equipment into inventory */
                    memcpy(&borg_items[hole], &safe_items[INVEN_RIGHT],
                        sizeof(borg_item));

                    /* Move new item into equipment */
                    memcpy(&borg_items[INVEN_RIGHT],
                        &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

                    /* Only a single item */
                    borg_items[INVEN_RIGHT].iqty = qty;

                    /* Fix later */
                    fix = true;

                    /* Examine the inventory */
                    borg_notice(true);

                    /* Evaluate the inventory */
                    p_right = borg_power();

#if 0
                    /* dump list and power...  for debugging */
                    borg_note(format("Trying Item %s (best power %ld)", borg_items[INVEN_RIGHT].desc, p_right));
                    borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[INVEN_RIGHT].desc, borg.power));
#endif
                    /* Restore old item */
                    memcpy(&borg_items[INVEN_RIGHT], &safe_items[INVEN_RIGHT],
                        sizeof(borg_item));
                }

                /* Is this ring better than one of mine? */
                p = MAX(p_right, p_left);

                /* Restore hole */
                memcpy(&borg_items[hole], &safe_items[hole], sizeof(borg_item));
            }

            else /* non rings */
            {
                /* Move equipment into inventory */
                memcpy(&borg_items[hole], &safe_items[slot], sizeof(borg_item));

                /* Move new item into equipment */
                memcpy(&borg_items[slot], &borg_safe_shops[BORG_HOME].ware[n],
                    sizeof(borg_item));

                /* Only a single item */
                borg_items[slot].iqty = qty;

                /* Fix later */
                fix = true;

                /* Examine the inventory */
                borg_notice(true);

                /* Evaluate the inventory */
                p = borg_power();
#if 0
                /* dump list and power...  for debugging */
                borg_note(format("Trying Item %s (best power %ld)", borg_items[slot].desc, p));
                borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[slot].desc, borg.power));
#endif
                /* Restore old item */
                memcpy(&borg_items[slot], &safe_items[slot], sizeof(borg_item));
            } /* non rings */
        } /* equip */

        /* Consider new inventory.*/
        /* note, we may grab an equip able if, for example, we want to ID it */
        if (p <= b_p) {
            /* Restore hole if we are trying an item in inventory that didn't
             * work equipped */
            if (slot >= 0)
                borg_items[hole].iqty = 0;

            if (stack != -1)
                hole = stack;

            /* Require two empty slots */
            if (stack == -1 && hole == -1)
                continue;
            if (stack == -1 && (hole + 1) >= PACK_SLOTS)
                continue;

            /* Move new item into inventory */
            memcpy(&borg_items[hole], &borg_safe_shops[BORG_HOME].ware[n],
                sizeof(borg_item));

            /* Is this new item merging into an existing stack? */
            if (stack != -1) {
                /* Add a quantity to the stack */
                borg_items[hole].iqty = safe_items[hole].iqty + qty;

                /* for wands and staffs adjust charges */
                if (item->tval == TV_STAFF || item->tval == TV_WAND)
                    borg_items[hole].pval += (qty * charge_each);

            } else {
                /* Only a single item */
                borg_items[hole].iqty = qty;

                /* for wands and staffs adjust charges */
                if (item->tval == TV_STAFF || item->tval == TV_WAND)
                    borg_items[hole].pval = (qty * charge_each);
            }

            /* Fix later */
            fix = true;

            /* Examine the inventory */
            borg_notice(true);

            /* Evaluate the equipment */
            p = borg_power();
        }

        /* Restore hole */
        memcpy(&borg_items[hole], &safe_items[hole], sizeof(borg_item));

        /* Restore shop item */
        memcpy(&borg_shops[BORG_HOME].ware[n],
            &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

        /* Ignore "silly" purchases */
        if (p <= b_p)
            continue;

        /* Save the item and cost */
        b_n = n;
        b_p = p;
    }

    /* Examine the inventory */
    if (fix)
        borg_notice(true);

    /* Buy something */
    if ((b_n >= 0) && (b_p > borg.power)) {
        /* Go to the home */
        borg.goal.shop = BORG_HOME;

        /* Buy that item */
        borg.goal.ware = b_n;

        /* Success */
        return true;
    }

    /* Nope */
    return false;
}